

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall QMainWindowLayout::toggleToolBarsVisible(QMainWindowLayout *this)

{
  undefined8 uVar1;
  QWidgetData *pQVar2;
  bool bVar3;
  QWidget *pQVar4;
  long in_FS_OFFSET;
  QRect QVar5;
  QRect local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this[0x198] = (QMainWindowLayout)((byte)this[0x198] ^ 1);
  bVar3 = QWidget::isMaximized(*(QWidget **)(this + 0x98));
  if (bVar3) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QLayout::update((QLayout *)this);
      return;
    }
  }
  else {
    pQVar4 = QLayout::parentWidget((QLayout *)this);
    uVar1._0_4_ = (pQVar4->data->crect).x1.m_i;
    uVar1._4_4_ = (pQVar4->data->crect).y1.m_i;
    pQVar4 = QLayout::parentWidget((QLayout *)this);
    pQVar2 = pQVar4->data;
    local_48.x1.m_i = (pQVar2->crect).x1.m_i;
    local_48.y1.m_i = (pQVar2->crect).y1.m_i;
    local_48.x2.m_i = (pQVar2->crect).x2.m_i;
    local_48.y2.m_i = (pQVar2->crect).y2.m_i;
    QVar5 = QToolBarAreaLayout::rectHint((QToolBarAreaLayout *)(this + 0xa0),&local_48);
    local_48.y2.m_i = QVar5.y2.m_i.m_i + (uVar1._4_4_ - QVar5.y1.m_i);
    local_48.x2.m_i = (uVar1._0_4_ - QVar5.x1.m_i) + QVar5.x2.m_i.m_i;
    local_48._0_8_ = uVar1;
    pQVar4 = QLayout::parentWidget((QLayout *)this);
    QWidget::setGeometry(pQVar4,&local_48);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QMainWindowLayout::toggleToolBarsVisible()
{
    layoutState.toolBarAreaLayout.visible = !layoutState.toolBarAreaLayout.visible;
    if (!layoutState.mainWindow->isMaximized()) {
        QPoint topLeft = parentWidget()->geometry().topLeft();
        QRect r = parentWidget()->geometry();
        r = layoutState.toolBarAreaLayout.rectHint(r);
        r.moveTo(topLeft);
        parentWidget()->setGeometry(r);
    } else {
        update();
    }
}